

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

error eval_expr(atom expr,atom env,atom *result)

{
  anon_union_8_9_1d3277aa_for_value aVar1;
  anon_union_8_9_1d3277aa_for_value *paVar2;
  undefined8 uVar3;
  char *symbol;
  ulong uVar4;
  uint uVar5;
  int saved_size;
  error eVar6;
  atom a;
  atom env_00;
  atom expr_00;
  atom expr_01;
  atom env_01;
  atom env_02;
  atom expr_02;
  atom env_03;
  atom env_04;
  atom expr_03;
  atom expr_04;
  atom parent;
  atom env_05;
  atom fn_00;
  atom env_06;
  atom env_07;
  atom args_00;
  atom env_08;
  atom args_01;
  atom env_09;
  atom env_10;
  atom arg_names_00;
  atom a_00;
  atom a_01;
  atom a_02;
  atom a_03;
  atom a_04;
  atom item;
  atom a_05;
  atom value;
  atom value_00;
  atom body;
  atom body_00;
  atom aVar7;
  atom arg_names;
  atom r;
  atom *p;
  vector vargs;
  atom fn;
  atom macro;
  atom name;
  undefined1 auStack_98 [4];
  error err_1;
  atom val;
  atom sym;
  atom cond;
  atom *p_1;
  atom args;
  atom op;
  int ss;
  error err;
  atom *result_local;
  atom env_local;
  atom expr_local;
  
  env_local._0_8_ = env.value;
  expr_local._0_8_ = expr.value;
  env_local.value._0_4_ = expr.type;
  result_local = (atom *)(ulong)env.type;
  saved_size = (int)stack_size;
LAB_00106c67:
  do {
    aVar7._0_8_ = (ulong)env_local.value.pair & 0xffffffff;
    aVar7.value = (anon_union_8_9_1d3277aa_for_value)expr_local._0_8_;
    stack_add(aVar7);
    a.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
    a._0_8_ = result_local;
    stack_add(a);
    consider_gc();
    if (env_local.value._0_4_ == 2) {
      env_00.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
      env_00._0_8_ = result_local;
      eVar6 = env_get(env_00,(char *)expr_local._0_8_,result);
      err_expr.value = (anon_union_8_9_1d3277aa_for_value)expr_local._0_8_;
      err_expr._0_8_ = env_local.value;
      return eVar6;
    }
    if (env_local.value._0_4_ != 1) {
      *(anon_union_8_9_1d3277aa_for_value *)result = env_local.value;
      result->value = (anon_union_8_9_1d3277aa_for_value)expr_local._0_8_;
      return ERROR_OK;
    }
    args.value = *(anon_union_8_9_1d3277aa_for_value *)expr_local._0_8_;
    aVar1 = (anon_union_8_9_1d3277aa_for_value)
            ((anon_union_8_9_1d3277aa_for_value *)(expr_local._0_8_ + 8))->pair;
    p_1 = *(atom **)(expr_local._0_8_ + 0x10);
    args._0_8_ = *(undefined8 *)(expr_local._0_8_ + 0x18);
    if (args.value._0_4_ != 2) {
LAB_001071d0:
      expr_03._0_8_ = (ulong)args.value.pair & 0xffffffff;
      expr_03.value.pair = aVar1.pair;
      env_09.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
      env_09._0_8_ = result_local;
      eVar6 = eval_expr(expr_03,env_09,(atom *)&vargs.size);
      if (eVar6 != ERROR_OK) {
        stack_restore(saved_size);
        return eVar6;
      }
      vector_new((vector *)&p);
      for (r.value.pair = (pair *)&p_1; ((r.value.pair)->car).type != T_NIL;
          r.value.pair = (pair *)((r.value.table)->size + 0x10)) {
        expr_04._4_4_ = 0;
        expr_04.type = *(uint *)(r.value.fp)->_IO_read_ptr;
        expr_04.value.pair =
             ((anon_union_8_9_1d3277aa_for_value *)((long)(r.value.fp)->_IO_read_ptr + 8))->pair;
        env_10.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_10._0_8_ = result_local;
        eVar6 = eval_expr(expr_04,env_10,(atom *)&arg_names.value);
        if (eVar6 != ERROR_OK) {
          vector_free((vector *)&p);
          stack_restore(saved_size);
          return eVar6;
        }
        item._4_4_ = 0;
        item.type = arg_names.value._0_4_;
        item.value = (anon_union_8_9_1d3277aa_for_value)r._0_8_;
        vector_add((vector *)&p,item);
      }
      if ((uint)vargs.size != 5) {
        fn_00._4_4_ = 0;
        fn_00.type = (uint)vargs.size;
        fn_00.value = (anon_union_8_9_1d3277aa_for_value)fn._0_8_;
        eVar6 = apply(fn_00,(vector *)&p,result);
        vector_free((vector *)&p);
        a_05._4_4_ = 0;
        a_05.type = result->type;
        a_05.value.pair = (result->value).pair;
        stack_restore_add(saved_size,a_05);
        return eVar6;
      }
      uVar4 = **(ulong **)(fn._0_8_ + 0x18);
      arg_names._0_8_ = (*(ulong **)(fn._0_8_ + 0x18))[1];
      parent._4_4_ = 0;
      parent.type = *(uint *)fn._0_8_;
      parent.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(fn._0_8_ + 8))->pair;
      aVar7 = env_create(parent);
      env_local._0_8_ = aVar7.value;
      result_local = (atom *)(ulong)aVar7.type;
      env_local.value = *(anon_union_8_9_1d3277aa_for_value *)(*(long *)(fn._0_8_ + 0x18) + 0x10);
      expr_local._0_8_ = *(undefined8 *)(*(long *)(fn._0_8_ + 0x18) + 0x18);
      env_05._4_4_ = 0;
      env_05.type = aVar7.type;
      arg_names_00._0_8_ = uVar4 & 0xffffffff;
      env_05.value = (anon_union_8_9_1d3277aa_for_value)
                     (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
      arg_names_00.value = (anon_union_8_9_1d3277aa_for_value)arg_names._0_8_;
      eVar6 = env_bind(env_05,arg_names_00,(vector *)&p);
      if (eVar6 != ERROR_OK) {
        return eVar6;
      }
      vector_free((vector *)&p);
      stack_restore(saved_size);
      goto LAB_00106c67;
    }
    if (aVar1.pair == sym_if.value.pair) {
      cond.value.pair = (pair *)&p_1;
      while( true ) {
        if (((cond.value.pair)->car).type == T_NIL) {
          result->type = T_NIL;
          *(undefined4 *)&result->field_0x4 = 0;
          result->value = (anon_union_8_9_1d3277aa_for_value)0x0;
          a_00._4_4_ = 0;
          a_00.type = result->type;
          a_00.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_00);
          return ERROR_OK;
        }
        if (*(int *)((cond.value.table)->size + 0x10) == 0) {
          env_local.value = *(anon_union_8_9_1d3277aa_for_value *)(cond.value.fp)->_IO_read_ptr;
          expr_local._0_8_ = ((anon_union_8_9_1d3277aa_for_value *)(cond.value.fp)->_IO_read_ptr)[1]
          ;
          goto LAB_00106c67;
        }
        expr_00._4_4_ = 0;
        expr_00.type = *(uint *)(cond.value.fp)->_IO_read_ptr;
        expr_00.value.pair =
             ((anon_union_8_9_1d3277aa_for_value *)((long)(cond.value.fp)->_IO_read_ptr + 8))->pair;
        env_06.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_06._0_8_ = result_local;
        eVar6 = eval_expr(expr_00,env_06,(atom *)&sym.value);
        if (eVar6 != ERROR_OK) {
          stack_restore(saved_size);
          return eVar6;
        }
        if (sym.value._0_4_ != 0) break;
        cond.value.pair = (pair *)(*(long *)((cond.value.table)->size + 0x18) + 0x10);
      }
      paVar2 = *(anon_union_8_9_1d3277aa_for_value **)((cond.value.table)->size + 0x18);
      env_local.value = *paVar2;
      expr_local._0_8_ = paVar2[1];
    }
    else {
      if (aVar1.pair == sym_assign.value.pair) {
        if (((int)p_1 == 0) || (*(uint *)(args._0_8_ + 0x10) == 0)) {
          stack_restore(saved_size);
          return ERROR_ARGS;
        }
        val.value = *(char *)args._0_8_;
        sym.type = *(uint *)(args._0_8_ + 8);
        sym._4_4_ = *(uint *)(args._0_8_ + 0xc);
        if (val.value._0_4_ != 2) {
          stack_restore(saved_size);
          return ERROR_TYPE;
        }
        expr_01._4_4_ = 0;
        expr_01.type = **(uint **)(args._0_8_ + 0x18);
        expr_01.value.pair =
             ((anon_union_8_9_1d3277aa_for_value *)(*(uint **)(args._0_8_ + 0x18) + 2))->pair;
        env_07.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_07._0_8_ = result_local;
        eVar6 = eval_expr(expr_01,env_07,(atom *)auStack_98);
        if (eVar6 != ERROR_OK) {
          stack_restore(saved_size);
          return eVar6;
        }
        *(ulong *)result = CONCAT44(err_1,auStack_98);
        result->value = (anon_union_8_9_1d3277aa_for_value)val._0_8_;
        value._4_4_ = 0;
        value.type = (type)auStack_98;
        env_01.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_01._0_8_ = result_local;
        value.value = (anon_union_8_9_1d3277aa_for_value)val._0_8_;
        eVar6 = env_assign_eq(env_01,(char *)sym._0_8_,value);
        a_01._4_4_ = 0;
        a_01.type = result->type;
        a_01.value.pair = (result->value).pair;
        stack_restore_add(saved_size,a_01);
        return eVar6;
      }
      if (aVar1.pair == sym_quote.value.pair) {
        if (((int)p_1 != 0) && (*(uint *)(args._0_8_ + 0x10) == 0)) {
          uVar5 = *(uint *)(args._0_8_ + 4);
          result->type = *(uint *)(args._0_8_ + 0);
          *(uint *)&result->field_0x4 = uVar5;
          result->value = *(anon_union_8_9_1d3277aa_for_value *)(args._0_8_ + 8);
          a_02._4_4_ = 0;
          a_02.type = result->type;
          a_02.value.pair = (result->value).pair;
          stack_restore_add(saved_size,a_02);
          return ERROR_OK;
        }
        stack_restore(saved_size);
        return ERROR_ARGS;
      }
      if (aVar1.pair == sym_fn.value.pair) {
        if ((int)p_1 == 0) {
          stack_restore(saved_size);
          return ERROR_ARGS;
        }
        args_00._4_4_ = 0;
        args_00.type = *(uint *)args._0_8_;
        body._4_4_ = 0;
        body.type = *(uint *)(args._0_8_ + 0x10);
        env_02.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_02._0_8_ = result_local;
        args_00.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(args._0_8_ + 8))->pair;
        body.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(args._0_8_ + 0x18))->pair;
        eVar6 = make_closure(env_02,args_00,body,result);
        a_03._4_4_ = 0;
        a_03.type = result->type;
        a_03.value.pair = (result->value).pair;
        stack_restore_add(saved_size,a_03);
        return eVar6;
      }
      if (aVar1.pair != sym_do.value.pair) {
        if (aVar1.pair == sym_mac.value.pair) {
          if ((((int)p_1 == 0) || (*(uint *)(args._0_8_ + 0x10) == 0)) ||
             (*(int *)(*(long *)(args._0_8_ + 0x18) + 0x10) == 0)) {
            stack_restore(saved_size);
            return ERROR_ARGS;
          }
          uVar3 = *(undefined8 *)args._0_8_;
          symbol = *(char **)(args._0_8_ + 8);
          macro.value._0_4_ = (undefined4)uVar3;
          if (macro.value._0_4_ != 2) {
            stack_restore(saved_size);
            return ERROR_TYPE;
          }
          args_01._4_4_ = 0;
          args_01.type = **(uint **)(args._0_8_ + 0x18);
          body_00._4_4_ = 0;
          body_00.type = *(uint *)(*(long *)(args._0_8_ + 0x18) + 0x10);
          env_03.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
          env_03._0_8_ = result_local;
          args_01.value.pair =
               ((anon_union_8_9_1d3277aa_for_value *)(*(uint **)(args._0_8_ + 0x18) + 2))->pair;
          body_00.value.pair =
               ((anon_union_8_9_1d3277aa_for_value *)(*(long *)(args._0_8_ + 0x18) + 0x18))->pair;
          eVar6 = make_closure(env_03,args_01,body_00,(atom *)&fn.value);
          if (eVar6 == ERROR_OK) {
            fn.value._0_4_ = 6;
            *(undefined8 *)result = uVar3;
            (result->value).symbol = symbol;
            env_04.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
            env_04._0_8_ = result_local;
            value_00.value = (anon_union_8_9_1d3277aa_for_value)macro._0_8_;
            value_00._0_8_ = 6;
            eVar6 = env_assign(env_04,symbol,value_00);
            a_04._4_4_ = 0;
            a_04.type = result->type;
            a_04.value.pair = (result->value).pair;
            stack_restore_add(saved_size,a_04);
            return eVar6;
          }
          stack_restore(saved_size);
          return eVar6;
        }
        goto LAB_001071d0;
      }
      while( true ) {
        if ((int)p_1 == 0) {
          return ERROR_OK;
        }
        if (*(int *)(args._0_8_ + 0x10) == 0) break;
        expr_02._4_4_ = 0;
        expr_02.type = *(uint *)args._0_8_;
        expr_02.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(args._0_8_ + 8))->pair;
        env_08.value = (anon_union_8_9_1d3277aa_for_value)env_local._0_8_;
        env_08._0_8_ = result_local;
        eVar6 = eval_expr(expr_02,env_08,result);
        if (eVar6 != ERROR_OK) {
          return eVar6;
        }
        p_1 = *(atom **)(args._0_8_ + 0x10);
        args._0_8_ = *(undefined8 *)(args._0_8_ + 0x18);
      }
      env_local.value = *(anon_union_8_9_1d3277aa_for_value *)args._0_8_;
      expr_local._0_8_ = *(undefined8 *)(args._0_8_ + 8);
      stack_restore(saved_size);
    }
  } while( true );
}

Assistant:

error eval_expr(atom expr, atom env, atom *result)
{
	error err;
	int ss = stack_size; /* save stack point */
start_eval:
	stack_add(expr);
	stack_add(env);
	consider_gc();
	if (expr.type == T_SYM) {
		err = env_get(env, expr.value.symbol, result);
		err_expr = expr;
		return err;
	}
	else if (expr.type != T_CONS) {
		*result = expr;
		return ERROR_OK;
	}
	else {
		atom op = car(expr);
		atom args = cdr(expr);

		if (op.type == T_SYM) {
			/* Handle special forms */
			if (op.value.symbol == sym_if.value.symbol) {
				atom *p = &args;
				while (!no(*p)) {
					atom cond;
					if (no(cdr(*p))) { /* else */
						/* tail call optimization of else part */
						expr = car(*p);
						goto start_eval;
					}
					err = eval_expr(car(*p), env, &cond);
					if (err) {
						stack_restore(ss);
						return err;
					}
					if (!no(cond)) { /* then */
						/* tail call optimization of err = eval_expr(car(cdr(*p)), env, result); */
						expr = car(cdr(*p));
						goto start_eval;
					}
					p = &cdr(cdr(*p));
				}
				*result = nil;
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_assign.value.symbol) {
				atom sym;
				if (no(args) || no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				sym = car(args);
				if (sym.type == T_SYM) {
					atom val;
					err = eval_expr(car(cdr(args)), env, &val);
					if (err) {
						stack_restore(ss);
						return err;
					}

					*result = val;
					err = env_assign_eq(env, sym.value.symbol, val);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return ERROR_TYPE;
				}
			}
			else if (op.value.symbol == sym_quote.value.symbol) {
				if (no(args) || !no(cdr(args))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				*result = car(args);
				stack_restore_add(ss, *result);
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_fn.value.symbol) {
				if (no(args)) {
					stack_restore(ss);
					return ERROR_ARGS;
				}
				err = make_closure(env, car(args), cdr(args), result);
				stack_restore_add(ss, *result);
				return err;
			}
			else if (op.value.symbol == sym_do.value.symbol) {
				/* Evaluate the body */
				while (!no(args)) {
					if (no(cdr(args))) {
						/* tail call */
						expr = car(args);
						stack_restore(ss);
						goto start_eval;
					}
					error err = eval_expr(car(args), env, result);
					if (err) {
						return err;
					}
					args = cdr(args);
				}
				return ERROR_OK;
			}
			else if (op.value.symbol == sym_mac.value.symbol) { /* (mac name (arg ...) body) */
				atom name, macro;

				if (no(args) || no(cdr(args)) || no(cdr(cdr(args)))) {
					stack_restore(ss);
					return ERROR_ARGS;
				}

				name = car(args);
				if (name.type != T_SYM) {
					stack_restore(ss);
					return ERROR_TYPE;
				}

				err = make_closure(env, car(cdr(args)), cdr(cdr(args)), &macro);
				if (!err) {
					macro.type = T_MACRO;
					*result = name;
					err = env_assign(env, name.value.symbol, macro);
					stack_restore_add(ss, *result);
					return err;
				}
				else {
					stack_restore(ss);
					return err;
				}
			}
		}

		/* Evaluate operator */
		atom fn;
		err = eval_expr(op, env, &fn);
		if (err) {
			stack_restore(ss);
			return err;
		}

		/* Evaulate arguments */
		struct vector vargs;
		vector_new(&vargs);
		atom *p = &args;
		while (!no(*p)) {
			atom r;
			err = eval_expr(car(*p), env, &r);
			if (err) {
				vector_free(&vargs);
				stack_restore(ss);
				return err;
			}
			vector_add(&vargs, r);
			p = &cdr(*p);
		}

		/* tail call optimization of err = apply(fn, args, result); */
		if (fn.type == T_CLOSURE) {
			atom arg_names = car(cdr(fn));
			env = env_create(car(fn));
			expr = cdr(cdr(fn));

			/* Bind the arguments */
			err = env_bind(env, arg_names, &vargs);
			if (err) {
				return err;
			}
			vector_free(&vargs);
			stack_restore(ss);
			goto start_eval;
		}
		else {
			err = apply(fn, &vargs, result);
			vector_free(&vargs);
		}
		stack_restore_add(ss, *result);
		return err;
	}
}